

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateVectorObjectAPITableExtension
          (SwiftGenerator *this,FieldDef *field_def)

{
  IdlNamer *this_00;
  CodeWriter *pCVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  BaseType BVar6;
  int iVar7;
  StructDef *pSVar8;
  long *plVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  ulong *puVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  string code;
  string var;
  string field;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  string local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  GenType_abi_cxx11_(&local_50,this,&(field_def->value).type,false);
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[7])(&local_350,this_00,field_def);
  (*(this_00->super_Namer)._vptr_Namer[0x12])(&local_310,this_00,field_def);
  BVar6 = (field_def->value).type.element;
  if ((int)BVar6 < 0xf) {
    if (BVar6 == BASE_TYPE_UTYPE) goto LAB_002f85ec;
    if (BVar6 == BASE_TYPE_STRING) {
      std::operator+(&local_370,"let __",&local_350);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390.field_2._8_8_ = plVar9[3];
      }
      else {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_390._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_390,(ulong)local_350._M_dataplus._M_p);
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_3b0.field_2._M_allocated_capacity = *puVar12;
        local_3b0.field_2._8_8_ = puVar10[3];
      }
      else {
        local_3b0.field_2._M_allocated_capacity = *puVar12;
        local_3b0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3b0._M_string_length = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2b0.field_2._M_allocated_capacity = *psVar11;
        local_2b0.field_2._8_8_ = plVar9[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *psVar11;
        local_2b0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_2b0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(&this->code_,&local_2b0);
      uVar13 = local_2b0.field_2._M_allocated_capacity;
      _Var14._M_p = local_2b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
LAB_002f7509:
        operator_delete(_Var14._M_p,uVar13 + 1);
      }
    }
    else {
LAB_002f7124:
      std::operator+(&local_370,"let __",&local_350);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390.field_2._8_8_ = puVar10[3];
      }
      else {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_390._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_390,(ulong)local_310._M_dataplus._M_p);
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      puVar12 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_3b0.field_2._M_allocated_capacity = *puVar12;
        local_3b0.field_2._8_8_ = plVar9[3];
      }
      else {
        local_3b0.field_2._M_allocated_capacity = *puVar12;
        local_3b0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3b0._M_string_length = plVar9[1];
      *plVar9 = (long)puVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_2d0.field_2._M_allocated_capacity = *psVar11;
        local_2d0.field_2._8_8_ = plVar9[3];
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = *psVar11;
        local_2d0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_2d0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(&this->code_,&local_2d0);
      uVar13 = local_2d0.field_2._M_allocated_capacity;
      _Var14._M_p = local_2d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) goto LAB_002f7509;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    uVar13 = local_370.field_2._M_allocated_capacity;
    _Var14._M_p = local_370._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p == &local_370.field_2) goto LAB_002f85ec;
  }
  else {
    if (BVar6 == BASE_TYPE_STRUCT) {
      pSVar8 = (field_def->value).type.struct_def;
      if ((pSVar8 == (StructDef *)0x0) || (pSVar8->fixed != false)) {
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"start_vector_of","");
        Namer::Method(&local_330,&this_00->super_Namer,&local_2f0,&local_350);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_330,0,(char *)0x0,0x384d40);
        paVar3 = &local_370.field_2;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_370.field_2._M_allocated_capacity = *psVar11;
          local_370.field_2._8_8_ = plVar9[3];
          local_370._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_370.field_2._M_allocated_capacity = *psVar11;
          local_370._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_370._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
        paVar4 = &local_390.field_2;
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_390.field_2._M_allocated_capacity = *psVar11;
          local_390.field_2._8_8_ = plVar9[3];
          local_390._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_390.field_2._M_allocated_capacity = *psVar11;
          local_390._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_390._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_390,(ulong)local_310._M_dataplus._M_p);
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        puVar12 = (ulong *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_3b0.field_2._M_allocated_capacity = *puVar12;
          local_3b0.field_2._8_8_ = plVar9[3];
        }
        else {
          local_3b0.field_2._M_allocated_capacity = *puVar12;
          local_3b0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_3b0._M_string_length = plVar9[1];
        *plVar9 = (long)puVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250.field_2._8_8_ = plVar9[3];
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_250._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        pCVar1 = &this->code_;
        CodeWriter::operator+=(pCVar1,&local_250);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != paVar4) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != paVar3) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        paVar5 = &local_330.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != paVar5) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
        }
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        local_3b0._M_string_length = 0;
        local_3b0.field_2._M_allocated_capacity =
             local_3b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pSVar8 = (field_def->value).type.struct_def;
        local_390._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"");
        local_370._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"");
        local_330._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"_o","");
        GenerateStructArgs(this,pSVar8,&local_3b0,&local_390,&local_370,&local_330,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != paVar5) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != paVar3) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != paVar4) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::substr((ulong)&local_390,(ulong)&local_3b0);
        std::__cxx11::string::operator=((string *)&local_3b0,(string *)&local_390);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != paVar4) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_390,"for i in obj.",&local_310);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_390);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_270.field_2._M_allocated_capacity = *psVar11;
          local_270.field_2._8_8_ = plVar9[3];
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        }
        else {
          local_270.field_2._M_allocated_capacity = *psVar11;
          local_270._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_270._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        CodeWriter::operator+=(pCVar1,&local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != paVar4) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        piVar2 = &(this->code_).cur_ident_lvl_;
        *piVar2 = *piVar2 + 1;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"guard let _o = i else { continue }","");
        CodeWriter::operator+=(pCVar1,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"builder.create(struct: _o)","");
        CodeWriter::operator+=(pCVar1,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        iVar7 = (this->code_).cur_ident_lvl_;
        if (iVar7 != 0) {
          (this->code_).cur_ident_lvl_ = iVar7 + -1;
        }
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"}","");
        CodeWriter::operator+=(pCVar1,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_330,"let __",&local_350);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_330);
        puVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_370.field_2._M_allocated_capacity = *puVar12;
          local_370.field_2._8_8_ = puVar10[3];
          local_370._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_370.field_2._M_allocated_capacity = *puVar12;
          local_370._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_370._M_string_length = puVar10[1];
        *puVar10 = puVar12;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_370,(ulong)local_310._M_dataplus._M_p);
        psVar11 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_390.field_2._M_allocated_capacity = *psVar11;
          local_390.field_2._8_8_ = puVar10[3];
          local_390._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_390.field_2._M_allocated_capacity = *psVar11;
          local_390._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_390._M_string_length = puVar10[1];
        *puVar10 = psVar11;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_390);
        psVar11 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_290.field_2._M_allocated_capacity = *psVar11;
          local_290.field_2._8_8_ = plVar9[3];
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        }
        else {
          local_290.field_2._M_allocated_capacity = *psVar11;
          local_290._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_290._M_string_length = plVar9[1];
        *plVar9 = (long)psVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        CodeWriter::operator+=(pCVar1,&local_290);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != paVar4) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != paVar3) {
          operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != paVar5) {
          operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
        }
        uVar13 = local_3b0.field_2._M_allocated_capacity;
        _Var14._M_p = local_3b0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p == &local_3b0.field_2) goto LAB_002f85ec;
        goto LAB_002f85e4;
      }
      std::operator+(&local_3b0,"var __",&local_350);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_1d0.field_2._M_allocated_capacity = *psVar11;
        local_1d0.field_2._8_8_ = plVar9[3];
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *psVar11;
        local_1d0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1d0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      pCVar1 = &this->code_;
      CodeWriter::operator+=(pCVar1,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      paVar3 = &local_3b0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_3b0,"for var i in obj.",&local_350);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_1f0.field_2._M_allocated_capacity = *psVar11;
        local_1f0.field_2._8_8_ = plVar9[3];
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      }
      else {
        local_1f0.field_2._M_allocated_capacity = *psVar11;
        local_1f0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1f0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(pCVar1,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      piVar2 = &(this->code_).cur_ident_lvl_;
      *piVar2 = *piVar2 + 1;
      std::operator+(&local_370,"__",&local_350);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
      paVar4 = &local_390.field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390.field_2._8_8_ = plVar9[3];
        local_390._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_390._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_390,(ulong)local_50._M_dataplus._M_p);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_3b0.field_2._M_allocated_capacity = *psVar11;
        local_3b0.field_2._8_8_ = plVar9[3];
        local_3b0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_3b0.field_2._M_allocated_capacity = *psVar11;
        local_3b0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3b0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_210.field_2._M_allocated_capacity = *psVar11;
        local_210.field_2._8_8_ = plVar9[3];
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar11;
        local_210._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_210._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(pCVar1,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != paVar4) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      iVar7 = (this->code_).cur_ident_lvl_;
      if (iVar7 != 0) {
        (this->code_).cur_ident_lvl_ = iVar7 + -1;
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"}","");
      CodeWriter::operator+=(pCVar1,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_370,"let __",&local_350);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390.field_2._8_8_ = puVar10[3];
        local_390._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_390._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_390,(ulong)local_350._M_dataplus._M_p);
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_3b0.field_2._M_allocated_capacity = *puVar12;
        local_3b0.field_2._8_8_ = puVar10[3];
        local_3b0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_3b0.field_2._M_allocated_capacity = *puVar12;
        local_3b0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3b0._M_string_length = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_230.field_2._M_allocated_capacity = *psVar11;
        local_230.field_2._8_8_ = plVar9[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar11;
        local_230._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_230._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(pCVar1,&local_230);
      uVar13 = local_230.field_2._M_allocated_capacity;
      _Var14._M_p = local_230._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
LAB_002f859f:
        operator_delete(_Var14._M_p,uVar13 + 1);
      }
    }
    else {
      if (BVar6 != BASE_TYPE_UNION) goto LAB_002f7124;
      std::operator+(&local_3b0,"var __",&local_350);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_130.field_2._M_allocated_capacity = *psVar11;
        local_130.field_2._8_8_ = plVar9[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar11;
        local_130._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_130._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      pCVar1 = &this->code_;
      CodeWriter::operator+=(pCVar1,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      paVar3 = &local_3b0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_3b0,"for i in obj.",&local_350);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_150.field_2._M_allocated_capacity = *psVar11;
        local_150.field_2._8_8_ = plVar9[3];
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar11;
        local_150._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_150._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(pCVar1,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      piVar2 = &(this->code_).cur_ident_lvl_;
      *piVar2 = *piVar2 + 1;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"guard let off = i?.pack(builder: &builder) else { continue }",
                 "");
      CodeWriter::operator+=(pCVar1,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_3b0,"__",&local_350);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_170.field_2._M_allocated_capacity = *psVar11;
        local_170.field_2._8_8_ = plVar9[3];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar11;
        local_170._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_170._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(pCVar1,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      iVar7 = (this->code_).cur_ident_lvl_;
      if (iVar7 != 0) {
        (this->code_).cur_ident_lvl_ = iVar7 + -1;
      }
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"}","");
      CodeWriter::operator+=(pCVar1,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_370,"let __",&local_350);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_370);
      paVar4 = &local_390.field_2;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390.field_2._8_8_ = plVar9[3];
        local_390._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_390._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_390,(ulong)local_350._M_dataplus._M_p);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_3b0.field_2._M_allocated_capacity = *psVar11;
        local_3b0.field_2._8_8_ = plVar9[3];
        local_3b0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_3b0.field_2._M_allocated_capacity = *psVar11;
        local_3b0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3b0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_190.field_2._M_allocated_capacity = *psVar11;
        local_190.field_2._8_8_ = plVar9[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *psVar11;
        local_190._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_190._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(pCVar1,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != paVar4) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_370,"let __",&local_350);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390.field_2._8_8_ = puVar10[3];
        local_390._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_390.field_2._M_allocated_capacity = *psVar11;
        local_390._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_390._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_390,(ulong)local_310._M_dataplus._M_p);
      puVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_3b0.field_2._M_allocated_capacity = *puVar12;
        local_3b0.field_2._8_8_ = puVar10[3];
        local_3b0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_3b0.field_2._M_allocated_capacity = *puVar12;
        local_3b0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3b0._M_string_length = puVar10[1];
      *puVar10 = puVar12;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3b0);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_1b0.field_2._M_allocated_capacity = *psVar11;
        local_1b0.field_2._8_8_ = plVar9[3];
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      }
      else {
        local_1b0.field_2._M_allocated_capacity = *psVar11;
        local_1b0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1b0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(pCVar1,&local_1b0);
      uVar13 = local_1b0.field_2._M_allocated_capacity;
      _Var14._M_p = local_1b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) goto LAB_002f859f;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    uVar13 = local_370.field_2._M_allocated_capacity;
    _Var14._M_p = local_370._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p == &local_370.field_2) goto LAB_002f85ec;
  }
LAB_002f85e4:
  operator_delete(_Var14._M_p,uVar13 + 1);
LAB_002f85ec:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenerateVectorObjectAPITableExtension(const FieldDef &field_def) {
    const Type &field_type = field_def.value.type;
    const auto type = GenType(field_type);
    const auto var = namer_.Variable(field_def);
    const auto field = namer_.Field(field_def);

    const auto vectortype = field_type.VectorType();
    switch (vectortype.base_type) {
      case BASE_TYPE_UNION: {
        code_ += "var __" + var + "__: [Offset] = []";
        code_ += "for i in obj." + var + " {";
        Indent();
        code_ += "guard let off = i?.pack(builder: &builder) else { continue }";
        code_ += "__" + var + "__.append(off)";
        Outdent();
        code_ += "}";
        code_ += "let __" + var + " = builder.createVector(ofOffsets: __" +
                 var + "__)";
        code_ += "let __" + var + "Type = builder.createVector(obj." + field +
                 ".compactMap { $0?.type })";
        break;
      }
      case BASE_TYPE_UTYPE: break;
      case BASE_TYPE_STRUCT: {
        if (field_type.struct_def && !field_type.struct_def->fixed) {
          code_ += "var __" + var + "__: [Offset] = []";
          code_ += "for var i in obj." + var + " {";
          Indent();
          code_ +=
              "__" + var + "__.append(" + type + ".pack(&builder, obj: &i))";
          Outdent();
          code_ += "}";
          code_ += "let __" + var + " = builder.createVector(ofOffsets: __" +
                   var + "__)";
        } else {
          code_ += "{{STRUCTNAME}}." + namer_.Method("start_vector_of", var) +
                   "(obj." + field + ".count, in: &builder)";
          std::string code;
          GenerateStructArgs(*field_type.struct_def, &code, "", "", "_o", true);
          code = code.substr(0, code.size() - 2);
          code_ += "for i in obj." + field + " {";
          Indent();
          code_ += "guard let _o = i else { continue }";
          code_ += "builder.create(struct: _o)";
          Outdent();
          code_ += "}";
          code_ += "let __" + var + " = builder.endVector(len: obj." + field +
                   ".count)";
        }
        break;
      }
      case BASE_TYPE_STRING: {
        code_ += "let __" + var + " = builder.createVector(ofStrings: obj." +
                 var + ".compactMap({ $0 }) )";
        break;
      }
      default: {
        code_ += "let __" + var + " = builder.createVector(obj." + field + ")";
        break;
      }
    }
  }